

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readResponseHeaders(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *this_00;
  HttpHeaders *this_01;
  HttpInputStreamImpl *this_02;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> coroutine;
  undefined8 *puVar3;
  StringPtr *header;
  undefined8 *puVar4;
  long lVar5;
  FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___00;
  undefined8 in_RSI;
  
  coroutine._M_fr_ptr = operator_new(0x548);
  *(code **)coroutine._M_fr_ptr = readResponseHeaders;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readResponseHeaders;
  this_00 = (Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x538) = in_RSI;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006daa60;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006daaa8;
  location.function = "readResponseHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x640;
  location.columnNumber = 0x3c;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_02 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x530);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006daa60;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006daaa8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  readMessageHeaders(this_02);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_02);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x540) = 0;
  bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar2) {
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
                 ((long)coroutine._M_fr_ptr + 0x470),__return_storage_ptr__);
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') &&
       (*(int *)((long)coroutine._M_fr_ptr + 0x430) - 1U < 2)) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_02->super_HttpInputStream)._vptr_HttpInputStream;
    if (node != (PromiseArenaMember *)0x0) {
      (this_02->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    uVar1 = ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
            ((long)coroutine._M_fr_ptr + 0x470))->tag;
    if (uVar1 == 1) {
      __return_storage_ptr___00 =
           (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
           ((long)coroutine._M_fr_ptr + 0x4f0);
      lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x538);
      this_01 = (HttpHeaders *)(lVar5 + 0x48);
      if (*(long *)(lVar5 + 0x58) != 0) {
        puVar4 = *(undefined8 **)(lVar5 + 0x50);
        puVar3 = puVar4 + *(long *)(lVar5 + 0x58) * 2;
        do {
          *puVar4 = "";
          puVar4[1] = 1;
          puVar4 = puVar4 + 2;
        } while (puVar4 != puVar3);
        lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x538);
      }
      *(undefined8 *)(lVar5 + 0x70) = *(undefined8 *)(lVar5 + 0x68);
      HttpHeaders::tryParseResponse
                (__return_storage_ptr___00,this_01,
                 *(ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x478));
      kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
      fulfill(this_00,__return_storage_ptr___00);
    }
    else {
      if (uVar1 != 2) {
        kj::_::unreachable();
      }
      __return_storage_ptr___00 =
           (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
           ((long)coroutine._M_fr_ptr + 0x4b0);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4b0) = 2;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4b8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c0) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x488);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x490);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x498);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e0) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a8);
      kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
      fulfill(this_00,__return_storage_ptr___00);
    }
    if (__return_storage_ptr___00->tag - 1 < 2) {
      __return_storage_ptr___00->tag = 0;
    }
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x540) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

inline kj::Promise<HttpHeaders::ResponseOrProtocolError> readResponseHeaders() {
    // Note: readResponseHeaders() could be called multiple times concurrently when pipelining
    //   requests. readMessageHeaders() will serialize these, but it's important not to mess with
    //   state (like calling headers.clear()) before said serialization has taken place.
    auto headersOrError = co_await readMessageHeaders();
    KJ_SWITCH_ONEOF(headersOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        headers.clear();
        co_return headers.tryParseResponse(text);
      }
    }

    KJ_UNREACHABLE;
  }